

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_proxy_stderr.c
# Opt level: O2

void log_proxy_stderr(Plug *plug,ProxyStderrBuf *psb,void *vdata,size_t len)

{
  uint __line;
  void *pvVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t __n;
  
  do {
    if (len == 0) {
      return;
    }
    uVar5 = psb->size;
    if (0x1fff < uVar5) {
      pcVar3 = "psb->size < lenof(psb->buf)";
      __line = 0x23;
LAB_001582d4:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/log_proxy_stderr.c"
                    ,__line,"void log_proxy_stderr(Plug *, ProxyStderrBuf *, const void *, size_t)")
      ;
    }
    uVar7 = 0x2000 - uVar5;
    if (len <= 0x2000 - uVar5) {
      uVar7 = len;
    }
    memcpy(psb->buf + uVar5,vdata,uVar7);
    vdata = (void *)((long)vdata + uVar7);
    len = len - uVar7;
    uVar7 = uVar7 + psb->size;
    psb->size = uVar7;
    uVar5 = 0;
    while (uVar5 <= uVar7 && uVar7 - uVar5 != 0) {
      pvVar1 = memchr(psb->buf + uVar5,10,uVar7 - uVar5);
      if (pvVar1 == (void *)0x0) break;
      uVar4 = (long)pvVar1 - (long)psb;
      uVar7 = uVar4;
      uVar2 = uVar4;
      if (uVar5 < uVar4) {
        uVar2 = uVar5;
      }
      for (; (uVar6 = uVar2, uVar5 < uVar7 &&
             ((psb->buf[uVar7 - 1] == '\r' || (uVar6 = uVar7, psb->buf[uVar7 - 1] == '\n'))));
          uVar7 = uVar7 - 1) {
      }
      pcVar3 = dupprintf("proxy: %.*s",(ulong)(uint)((int)uVar6 - (int)uVar5),psb->buf + uVar5);
      (*plug->vt->log)(plug,PLUGLOG_PROXY_MSG,(SockAddr *)0x0,0,pcVar3,0);
      safefree(pcVar3);
      uVar5 = uVar4 + 1;
      uVar7 = psb->size;
      if (uVar7 < uVar5) {
        pcVar3 = "pos <= psb->size";
        __line = 0x42;
        goto LAB_001582d4;
      }
    }
    if ((uVar5 == 0) && (uVar7 == 0x2000)) {
      pcVar3 = dupprintf("proxy (partial line): %.*s",0x2000,psb);
      (*plug->vt->log)(plug,PLUGLOG_PROXY_MSG,(SockAddr *)0x0,0,pcVar3,0);
      safefree(pcVar3);
      psb->size = 0;
      uVar7 = 0;
    }
    __n = uVar7 - uVar5;
    if (__n != 0) {
      memmove(psb,psb->buf + uVar5,__n);
    }
    psb->size = __n;
  } while( true );
}

Assistant:

void log_proxy_stderr(Plug *plug, ProxyStderrBuf *psb,
                      const void *vdata, size_t len)
{
    const char *data = (const char *)vdata;

    /*
     * This helper function allows us to collect the data written to a
     * local proxy command's standard error in whatever size chunks we
     * happen to get from its pipe, and whenever we have a complete
     * line, we pass it to plug_log.
     *
     * (We also do this when the buffer in psb fills up, to avoid just
     * allocating more and more memory forever, and also to keep Event
     * Log lines reasonably bounded in size.)
     *
     * Prerequisites: a plug to log to, and a ProxyStderrBuf stored
     * somewhere to collect any not-yet-output partial line.
     */

    while (len > 0) {
        /*
         * Copy as much data into psb->buf as will fit.
         */
        assert(psb->size < lenof(psb->buf));
        size_t to_consume = lenof(psb->buf) - psb->size;
        if (to_consume > len)
            to_consume = len;
        memcpy(psb->buf + psb->size, data, to_consume);
        data += to_consume;
        len -= to_consume;
        psb->size += to_consume;

        /*
         * Output any full lines in psb->buf.
         */
        size_t pos = 0;
        while (pos < psb->size) {
            char *nlpos = memchr(psb->buf + pos, '\n', psb->size - pos);
            if (!nlpos)
                break;

            /*
             * Found a newline in the buffer, so we can output a line.
             */
            size_t endpos = nlpos - psb->buf;
            while (endpos > pos && (psb->buf[endpos-1] == '\n' ||
                                    psb->buf[endpos-1] == '\r'))
                endpos--;
            char *msg = dupprintf(
                "proxy: %.*s", (int)(endpos - pos), psb->buf + pos);
            plug_log(plug, PLUGLOG_PROXY_MSG, NULL, 0, msg, 0);
            sfree(msg);

            pos = nlpos - psb->buf + 1;
            assert(pos <= psb->size);
        }

        /*
         * If the buffer is completely full and we didn't output
         * anything, then output the whole thing, flagging it as a
         * truncated line.
         */
        if (pos == 0 && psb->size == lenof(psb->buf)) {
            char *msg = dupprintf(
                "proxy (partial line): %.*s", (int)psb->size, psb->buf);
            plug_log(plug, PLUGLOG_PROXY_MSG, NULL, 0, msg, 0);
            sfree(msg);

            pos = psb->size = 0;
        }

        /*
         * Now move any remaining data up to the front of the buffer.
         */
        size_t newsize = psb->size - pos;
        if (newsize)
            memmove(psb->buf, psb->buf + pos, newsize);
        psb->size = newsize;

        /*
         * And loop round again if there's more data to be read from
         * our input.
         */
    }
}